

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance.cc
# Opt level: O0

int __thiscall StrSimilar::ldistance(StrSimilar *this,string *source,string *target)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  size_type __n;
  reference pvVar6;
  reference pvVar7;
  char *pcVar8;
  ulong in_RDX;
  ulong in_RSI;
  int diag;
  int left;
  int above;
  int cost;
  char dj;
  int j;
  char si;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Tmatrix matrix;
  int m;
  int n;
  int local_200;
  int local_1fc;
  int local_1f8;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  vector<int,_std::allocator<int>_> *this_00;
  string *in_stack_fffffffffffffe78;
  allocator *function;
  undefined8 in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  LogSeverity severity;
  uint local_11c;
  int local_114;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  undefined1 local_f9 [29];
  int local_dc;
  int local_d8;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  Logger local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  Logger local_24;
  ulong local_20;
  ulong local_18;
  int local_4;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  iVar3 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    Logger::Logger(&local_24,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance.cc"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"ldistance",&local_81);
    poVar5 = Logger::Start(severity,in_stack_fffffffffffffe88,iVar3,in_stack_fffffffffffffe78);
    poVar5 = std::operator<<(poVar5,"CHECK failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance.cc"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3f);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"!source.empty()");
    poVar5 = std::operator<<(poVar5," = ");
    bVar2 = std::__cxx11::string::empty();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar2 ^ 1));
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger((Logger *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    abort();
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_d8 = std::__cxx11::string::length();
    local_dc = std::__cxx11::string::length();
    if (local_dc == 0) {
      local_4 = local_d8;
    }
    else {
      local_4 = local_dc;
      if (local_d8 != 0) {
        __n = (size_type)(local_d8 + 1);
        this_00 = (vector<int,_std::allocator<int>_> *)local_f9;
        std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
                  ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x20e57b);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)this_00,__n,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
                  ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x20e5a1);
        for (local_100 = 0; local_100 <= local_d8; local_100 = local_100 + 1) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(local_f9 + 1),(long)local_100);
          std::vector<int,_std::allocator<int>_>::resize(this_00,__n);
        }
        for (local_104 = 1; local_104 <= local_d8; local_104 = local_104 + 1) {
          in_stack_fffffffffffffe14 = local_104;
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(local_f9 + 1),(long)local_104);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,0);
          *pvVar7 = in_stack_fffffffffffffe14;
        }
        for (local_108 = 1; local_108 <= local_dc; local_108 = local_108 + 1) {
          in_stack_fffffffffffffe10 = local_108;
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(local_f9 + 1),0);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_108);
          *pvVar7 = in_stack_fffffffffffffe10;
        }
        for (local_10c = 1; local_10c <= local_d8; local_10c = local_10c + 1) {
          pcVar8 = (char *)std::__cxx11::string::operator[](local_18);
          cVar1 = *pcVar8;
          for (local_114 = 1; local_114 <= local_dc; local_114 = local_114 + 1) {
            pcVar8 = (char *)std::__cxx11::string::operator[](local_20);
            local_11c = (uint)(cVar1 != *pcVar8);
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(local_f9 + 1),(long)(local_10c + -1));
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_114);
            local_1fc = *pvVar7 + 1;
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(local_f9 + 1),(long)local_10c);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar6,(long)(local_114 + -1));
            iVar3 = *pvVar7 + 1;
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(local_f9 + 1),(long)(local_10c + -1));
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar6,(long)(local_114 + -1));
            local_200 = *pvVar7 + local_11c;
            local_1f8 = local_200;
            if (iVar3 < local_200) {
              local_1f8 = iVar3;
            }
            if (local_1f8 <= local_1fc) {
              if (iVar3 < local_200) {
                local_200 = iVar3;
              }
              local_1fc = local_200;
            }
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(local_f9 + 1),(long)local_10c);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_114);
            *pvVar7 = local_1fc;
          }
        }
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(local_f9 + 1),(long)local_d8);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_dc);
        local_4 = *pvVar7;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      }
    }
    return local_4;
  }
  Logger::Logger(&local_88,ERR);
  function = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance.cc"
             ,function);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"ldistance",&local_d1);
  poVar5 = Logger::Start(severity,in_stack_fffffffffffffe88,iVar3,(string *)function);
  poVar5 = std::operator<<(poVar5,"CHECK failed ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance.cc"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x40);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"!target.empty()");
  poVar5 = std::operator<<(poVar5," = ");
  bVar2 = std::__cxx11::string::empty();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar2 ^ 1));
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Logger::~Logger((Logger *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  abort();
}

Assistant:

int StrSimilar::ldistance(const std::string& source,
                          const std::string& target) {
  CHECK(!source.empty());
  CHECK(!target.empty());
  //step 1
  int n = source.length();
  int m = target.length();
  if (m == 0) return n;
  if (n == 0) return m;
  //Construct a matrix
  typedef std::vector<std::vector<int> >  Tmatrix;
  Tmatrix matrix(n + 1);
  for (int i = 0; i <= n; i++)  { matrix[i].resize(m + 1); }
  //step 2 Initialize
  for (int i = 1; i <= n; i++) { matrix[i][0] = i; }
  for (int i = 1; i <= m; i++) { matrix[0][i] = i; }
  //step 3
  for (int i = 1; i <= n; i++) {
    const char si = source[i - 1];
    //step 4
    for (int j = 1; j <= m; j++) {
      const char dj = target[j - 1];
      //step 5
      int cost;
      if (si == dj) { cost = 0; }
      else { cost = 1; }
      //step 6
      const int above = matrix[i - 1][j] + 1;
      const int left = matrix[i][j - 1] + 1;
      const int diag = matrix[i - 1][j - 1] + cost;
      matrix[i][j] = min(above, min(left, diag));
     }
  }
  //step 7
  return matrix[n][m];
}